

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.h
# Opt level: O0

void GEN_CS::gen_cs_example<false>(cb_to_cs_adf *c,multi_ex *ec_seq,label *cs_labels)

{
  ulong uVar1;
  ostream *this;
  undefined8 uVar2;
  ulong *in_RDI;
  stringstream __msg;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 uVar3;
  int in_stack_fffffffffffffe34;
  char *in_stack_fffffffffffffe38;
  vw_exception *in_stack_fffffffffffffe40;
  label *in_stack_fffffffffffffe48;
  cb_to_cs_adf *in_stack_fffffffffffffe50;
  multi_ex *in_stack_fffffffffffffe58;
  cb_to_cs_adf *in_stack_fffffffffffffe60;
  ostream local_190;
  ulong *local_8;
  
  uVar1 = *in_RDI;
  if (uVar1 == 0) {
    gen_cs_example_dr<false>
              (in_stack_fffffffffffffe50,(multi_ex *)in_stack_fffffffffffffe48,
               (label *)in_stack_fffffffffffffe40);
  }
  else if (uVar1 == 2) {
    gen_cs_example_ips((multi_ex *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  }
  else {
    if (uVar1 != 3) {
      local_8 = in_RDI;
      std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe60);
      this = std::operator<<(&local_190,"Unknown cb_type specified for contextual bandit learning: "
                            );
      std::ostream::operator<<(this,*local_8);
      uVar3 = 1;
      uVar2 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                 (string *)CONCAT17(uVar3,in_stack_fffffffffffffe28));
      __cxa_throw(uVar2,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    gen_cs_example_mtr(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                       (label *)in_stack_fffffffffffffe50);
  }
  return;
}

Assistant:

void gen_cs_example(cb_to_cs_adf& c, multi_ex& ec_seq, COST_SENSITIVE::label& cs_labels)
{
  switch (c.cb_type)
  {
    case CB_TYPE_IPS:
      gen_cs_example_ips(ec_seq, cs_labels);
      break;
    case CB_TYPE_DR:
      gen_cs_example_dr<is_learn>(c, ec_seq, cs_labels);
      break;
    case CB_TYPE_MTR:
      gen_cs_example_mtr(c, ec_seq, cs_labels);
      break;
    default:
      THROW("Unknown cb_type specified for contextual bandit learning: " << c.cb_type);
  }
}